

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

string * unicode_cpt_to_utf8_abi_cxx11_(uint32_t cpt)

{
  invalid_argument *this;
  uint in_ESI;
  char cVar1;
  string *in_RDI;
  string *result;
  
  std::__cxx11::string::string((string *)in_RDI);
  cVar1 = (char)in_RDI;
  if (in_ESI < 0x80) {
    std::__cxx11::string::push_back(cVar1);
  }
  else if ((in_ESI < 0x80) || (0x7ff < in_ESI)) {
    if ((in_ESI < 0x800) || (0xffff < in_ESI)) {
      if ((in_ESI < 0x10000) || (0x10ffff < in_ESI)) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"invalid codepoint");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
    }
    else {
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
    }
  }
  else {
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
  }
  return in_RDI;
}

Assistant:

std::string unicode_cpt_to_utf8(uint32_t cpt) {
    std::string result;

    if (/* 0x00 <= cpt && */ cpt <= 0x7f) {
        result.push_back(cpt);
        return result;
    }
    if (0x80 <= cpt && cpt <= 0x7ff) {
        result.push_back(0xc0 | ((cpt >> 6) & 0x1f));
        result.push_back(0x80 | (cpt & 0x3f));
        return result;
    }
    if (0x800 <= cpt && cpt <= 0xffff) {
        result.push_back(0xe0 | ((cpt >> 12) & 0x0f));
        result.push_back(0x80 | ((cpt >> 6) & 0x3f));
        result.push_back(0x80 | (cpt & 0x3f));
        return result;
    }
    if (0x10000 <= cpt && cpt <= 0x10ffff) {
        result.push_back(0xf0 | ((cpt >> 18) & 0x07));
        result.push_back(0x80 | ((cpt >> 12) & 0x3f));
        result.push_back(0x80 | ((cpt >> 6) & 0x3f));
        result.push_back(0x80 | (cpt & 0x3f));
        return result;
    }

    throw std::invalid_argument("invalid codepoint");
}